

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O0

void MyCompiler::traverseIdentsTerm
               (Term *ast,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *usedIdents)

{
  bool bVar1;
  element_type *ast_00;
  reference ppVar2;
  pair<MyCompiler::MulDivOp,_MyCompiler::Factor> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *usedIdents_local;
  Term *ast_local;
  
  ast_00 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ast->pFactor);
  traverseIdentsFactor(ast_00,usedIdents);
  __end1 = std::
           vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
           ::begin(&ast->vMulDivOpFactor);
  item = (pair<MyCompiler::MulDivOp,_MyCompiler::Factor> *)
         std::
         vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
         ::end(&ast->vMulDivOpFactor);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_*,_std::vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>_>
                                *)&item);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_*,_std::vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>_>
             ::operator*(&__end1);
    traverseIdentsFactor(&ppVar2->second,usedIdents);
    __gnu_cxx::
    __normal_iterator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_*,_std::vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void MyCompiler::traverseIdentsTerm(MyCompiler::Term &ast,
                                    std::unordered_set<std::string> &usedIdents)
{
    traverseIdentsFactor(*ast.pFactor, usedIdents);
    for (auto &item : ast.vMulDivOpFactor)
        traverseIdentsFactor(item.second, usedIdents);
}